

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 local_14a8 [16];
  long local_1490;
  long local_1488;
  ulong local_1480;
  NodeRef *local_1478;
  Scene *local_1470;
  RTCFilterFunctionNArguments args;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_1478 = stack + 1;
  stack[0] = root;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar51 = ZEXT3264(auVar36);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar52 = ZEXT3264(auVar37);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar53 = ZEXT3264(auVar38);
  auVar22 = vmulss_avx512f(auVar36._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar36._0_4_ = auVar22._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar36._16_4_ = auVar36._0_4_;
  auVar36._20_4_ = auVar36._0_4_;
  auVar36._24_4_ = auVar36._0_4_;
  auVar36._28_4_ = auVar36._0_4_;
  auVar22 = vmulss_avx512f(auVar37._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar37._0_4_ = auVar22._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar37._16_4_ = auVar37._0_4_;
  auVar37._20_4_ = auVar37._0_4_;
  auVar37._24_4_ = auVar37._0_4_;
  auVar37._28_4_ = auVar37._0_4_;
  auVar22 = vmulss_avx512f(auVar38._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar38._0_4_ = auVar22._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar38._16_4_ = auVar38._0_4_;
  auVar38._20_4_ = auVar38._0_4_;
  auVar38._24_4_ = auVar38._0_4_;
  auVar38._28_4_ = auVar38._0_4_;
  local_1480 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar13 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar16 = local_1480 ^ 0x20;
  auVar40._8_4_ = 0x80000000;
  auVar40._0_8_ = 0x8000000080000000;
  auVar40._12_4_ = 0x80000000;
  auVar40._16_4_ = 0x80000000;
  auVar40._20_4_ = 0x80000000;
  auVar40._24_4_ = 0x80000000;
  auVar40._28_4_ = 0x80000000;
  auVar36 = vxorps_avx512vl(auVar36,auVar40);
  auVar54 = ZEXT3264(auVar36);
  auVar36 = vxorps_avx512vl(auVar37,auVar40);
  auVar55 = ZEXT3264(auVar36);
  auVar36 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar56 = ZEXT3264(auVar36);
  auVar36 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar57 = ZEXT3264(auVar36);
  auVar36 = vxorps_avx512vl(auVar38,auVar40);
  auVar58 = ZEXT3264(auVar36);
  auVar22 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar59 = ZEXT1664(auVar22);
  bVar19 = true;
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar60 = ZEXT1664(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar61 = ZEXT1664(auVar22);
  auVar22 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar62 = ZEXT1664(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar63 = ZEXT1664(auVar22);
  do {
    uVar15 = local_1478[-1].ptr;
    local_1478 = local_1478 + -1;
    while ((uVar15 & 8) == 0) {
      auVar36 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar15 + 0x40 + local_1480),auVar54._0_32_,
                           auVar51._0_32_);
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar15 + 0x40 + uVar13),auVar55._0_32_,
                           auVar52._0_32_);
      auVar36 = vpmaxsd_avx2(auVar36,auVar37);
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar15 + 0x40 + uVar17),auVar58._0_32_,
                           auVar53._0_32_);
      auVar37 = vpmaxsd_avx512vl(auVar37,auVar56._0_32_);
      auVar36 = vpmaxsd_avx2(auVar36,auVar37);
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar15 + 0x40 + uVar16),auVar54._0_32_,
                           auVar51._0_32_);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar15 + 0x40 + (uVar13 ^ 0x20)),auVar55._0_32_,
                           auVar52._0_32_);
      auVar37 = vpminsd_avx2(auVar37,auVar38);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar15 + 0x40 + (uVar17 ^ 0x20)),auVar58._0_32_,
                           auVar53._0_32_);
      auVar38 = vpminsd_avx512vl(auVar38,auVar57._0_32_);
      auVar37 = vpminsd_avx2(auVar37,auVar38);
      uVar11 = vpcmpd_avx512vl(auVar36,auVar37,2);
      if ((char)uVar11 == '\0') goto LAB_0077e47a;
      uVar10 = uVar15 & 0xfffffffffffffff0;
      lVar12 = 0;
      for (uVar15 = uVar11; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar12 = lVar12 + 1;
      }
      uVar15 = *(ulong *)(uVar10 + lVar12 * 8);
      uVar14 = (uint)uVar11 - 1 & (uint)uVar11;
      uVar11 = (ulong)uVar14;
      if (uVar14 != 0) {
        local_1478->ptr = uVar15;
        lVar12 = 0;
        for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        uVar14 = uVar14 - 1 & uVar14;
        uVar11 = (ulong)uVar14;
        bVar18 = uVar14 == 0;
        while( true ) {
          local_1478 = local_1478 + 1;
          uVar15 = *(ulong *)(uVar10 + lVar12 * 8);
          if (bVar18) break;
          local_1478->ptr = uVar15;
          lVar12 = 0;
          for (uVar15 = uVar11; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar12 = lVar12 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          bVar18 = uVar11 == 0;
        }
      }
    }
    local_1488 = (ulong)((uint)uVar15 & 0xf) - 8;
    if (local_1488 != 0) {
      uVar15 = uVar15 & 0xfffffffffffffff0;
      local_1490 = 0;
      do {
        lVar12 = local_1490 * 0xb0;
        auVar22 = *(undefined1 (*) [16])(uVar15 + 0x80 + lVar12);
        auVar35 = *(undefined1 (*) [16])(uVar15 + 0x40 + lVar12);
        auVar33 = *(undefined1 (*) [16])(uVar15 + 0x70 + lVar12);
        auVar32 = *(undefined1 (*) [16])(uVar15 + 0x50 + lVar12);
        auVar23._0_4_ = auVar35._0_4_ * auVar22._0_4_;
        auVar23._4_4_ = auVar35._4_4_ * auVar22._4_4_;
        auVar23._8_4_ = auVar35._8_4_ * auVar22._8_4_;
        auVar23._12_4_ = auVar35._12_4_ * auVar22._12_4_;
        auVar44 = *(undefined1 (*) [16])(uVar15 + 0x60 + lVar12);
        auVar45 = *(undefined1 (*) [16])(uVar15 + 0x30 + lVar12);
        local_1398 = vfmsub231ps_fma(auVar23,auVar33,auVar32);
        auVar27._0_4_ = auVar32._0_4_ * auVar44._0_4_;
        auVar27._4_4_ = auVar32._4_4_ * auVar44._4_4_;
        auVar27._8_4_ = auVar32._8_4_ * auVar44._8_4_;
        auVar27._12_4_ = auVar32._12_4_ * auVar44._12_4_;
        local_1388 = vfmsub231ps_fma(auVar27,auVar22,auVar45);
        auVar28._0_4_ = auVar45._0_4_ * auVar33._0_4_;
        auVar28._4_4_ = auVar45._4_4_ * auVar33._4_4_;
        auVar28._8_4_ = auVar45._8_4_ * auVar33._8_4_;
        auVar28._12_4_ = auVar45._12_4_ * auVar33._12_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar30._4_4_ = uVar1;
        auVar30._0_4_ = uVar1;
        auVar30._8_4_ = uVar1;
        auVar30._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_4_ = uVar1;
        auVar31._12_4_ = uVar1;
        fVar2 = *(float *)(ray + k * 4 + 0x60);
        auVar29._4_4_ = fVar2;
        auVar29._0_4_ = fVar2;
        auVar29._8_4_ = fVar2;
        auVar29._12_4_ = fVar2;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar26._4_4_ = uVar1;
        auVar26._0_4_ = uVar1;
        auVar26._8_4_ = uVar1;
        auVar26._12_4_ = uVar1;
        auVar23 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + lVar12),auVar26);
        local_1378 = vfmsub231ps_fma(auVar28,auVar44,auVar35);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar24._4_4_ = uVar1;
        auVar24._0_4_ = uVar1;
        auVar24._8_4_ = uVar1;
        auVar24._12_4_ = uVar1;
        auVar24 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + 0x10 + lVar12),auVar24);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar25._4_4_ = uVar1;
        auVar25._0_4_ = uVar1;
        auVar25._8_4_ = uVar1;
        auVar25._12_4_ = uVar1;
        auVar25 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar15 + 0x20 + lVar12),auVar25);
        auVar26 = vmulps_avx512vl(auVar31,auVar25);
        auVar27 = vfmsub231ps_avx512vl(auVar26,auVar24,auVar29);
        auVar26 = vmulps_avx512vl(auVar29,auVar23);
        auVar28 = vfmsub231ps_avx512vl(auVar26,auVar25,auVar30);
        auVar26 = vmulps_avx512vl(auVar30,auVar24);
        auVar29 = vfmsub231ps_avx512vl(auVar26,auVar23,auVar31);
        auVar50._0_4_ = fVar2 * local_1378._0_4_;
        auVar50._4_4_ = fVar2 * local_1378._4_4_;
        auVar50._8_4_ = fVar2 * local_1378._8_4_;
        auVar50._12_4_ = fVar2 * local_1378._12_4_;
        auVar26 = vfmadd231ps_fma(auVar50,local_1388,auVar31);
        auVar26 = vfmadd231ps_fma(auVar26,local_1398,auVar30);
        auVar30 = vandps_avx512vl(auVar26,auVar60._0_16_);
        auVar31 = vandps_avx512vl(auVar26,auVar61._0_16_);
        auVar22 = vmulps_avx512vl(auVar22,auVar29);
        auVar22 = vfmadd231ps_avx512vl(auVar22,auVar28,auVar33);
        auVar22 = vfmadd231ps_avx512vl(auVar22,auVar27,auVar44);
        uVar14 = auVar31._0_4_;
        auVar33._0_4_ = (float)(uVar14 ^ auVar22._0_4_);
        uVar47 = auVar31._4_4_;
        auVar33._4_4_ = (float)(uVar47 ^ auVar22._4_4_);
        uVar48 = auVar31._8_4_;
        auVar33._8_4_ = (float)(uVar48 ^ auVar22._8_4_);
        uVar49 = auVar31._12_4_;
        auVar33._12_4_ = (float)(uVar49 ^ auVar22._12_4_);
        auVar22 = vmulps_avx512vl(auVar32,auVar29);
        auVar22 = vfmadd231ps_avx512vl(auVar22,auVar35,auVar28);
        auVar22 = vfmadd231ps_avx512vl(auVar22,auVar45,auVar27);
        auVar35._0_4_ = (float)(uVar14 ^ auVar22._0_4_);
        auVar35._4_4_ = (float)(uVar47 ^ auVar22._4_4_);
        auVar35._8_4_ = (float)(uVar48 ^ auVar22._8_4_);
        auVar35._12_4_ = (float)(uVar49 ^ auVar22._12_4_);
        auVar22 = auVar62._0_16_;
        uVar6 = vcmpps_avx512vl(auVar33,auVar22,5);
        uVar7 = vcmpps_avx512vl(auVar35,auVar22,5);
        uVar8 = vcmpps_avx512vl(auVar26,auVar22,4);
        auVar22._0_4_ = auVar33._0_4_ + auVar35._0_4_;
        auVar22._4_4_ = auVar33._4_4_ + auVar35._4_4_;
        auVar22._8_4_ = auVar33._8_4_ + auVar35._8_4_;
        auVar22._12_4_ = auVar33._12_4_ + auVar35._12_4_;
        uVar9 = vcmpps_avx512vl(auVar22,auVar30,2);
        bVar20 = (byte)uVar6 & (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
        if (bVar20 != 0) {
          auVar45._0_4_ = auVar25._0_4_ * local_1378._0_4_;
          auVar45._4_4_ = auVar25._4_4_ * local_1378._4_4_;
          auVar45._8_4_ = auVar25._8_4_ * local_1378._8_4_;
          auVar45._12_4_ = auVar25._12_4_ * local_1378._12_4_;
          auVar22 = vfmadd213ps_fma(auVar24,local_1388,auVar45);
          auVar22 = vfmadd213ps_fma(auVar23,local_1398,auVar22);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar32 = vmulps_avx512vl(auVar30,auVar32);
          fVar2 = *(float *)(ray + k * 4 + 0x80);
          auVar44._0_4_ = (float)(uVar14 ^ auVar22._0_4_);
          auVar44._4_4_ = (float)(uVar47 ^ auVar22._4_4_);
          auVar44._8_4_ = (float)(uVar48 ^ auVar22._8_4_);
          auVar44._12_4_ = (float)(uVar49 ^ auVar22._12_4_);
          auVar46._0_4_ = fVar2 * auVar30._0_4_;
          auVar46._4_4_ = fVar2 * auVar30._4_4_;
          auVar46._8_4_ = fVar2 * auVar30._8_4_;
          auVar46._12_4_ = fVar2 * auVar30._12_4_;
          uVar6 = vcmpps_avx512vl(auVar44,auVar46,2);
          uVar7 = vcmpps_avx512vl(auVar32,auVar44,1);
          bVar20 = (byte)uVar6 & (byte)uVar7 & bVar20;
          if (bVar20 != 0) {
            local_1470 = context->scene;
            auVar22 = vrcp14ps_avx512vl(auVar30);
            auVar32 = vfnmadd213ps_avx512vl(auVar30,auVar22,auVar63._0_16_);
            auVar22 = vfmadd132ps_fma(auVar32,auVar22,auVar22);
            fVar39 = auVar22._0_4_;
            fVar41 = auVar22._4_4_;
            fVar42 = auVar22._8_4_;
            fVar43 = auVar22._12_4_;
            local_13a8[0] = fVar39 * auVar44._0_4_;
            local_13a8[1] = fVar41 * auVar44._4_4_;
            local_13a8[2] = fVar42 * auVar44._8_4_;
            local_13a8[3] = fVar43 * auVar44._12_4_;
            local_13c8[0] = fVar39 * auVar33._0_4_;
            local_13c8[1] = fVar41 * auVar33._4_4_;
            local_13c8[2] = fVar42 * auVar33._8_4_;
            local_13c8[3] = fVar43 * auVar33._12_4_;
            local_13b8._0_4_ = fVar39 * auVar35._0_4_;
            local_13b8._4_4_ = fVar41 * auVar35._4_4_;
            local_13b8._8_4_ = fVar42 * auVar35._8_4_;
            local_13b8._12_4_ = fVar43 * auVar35._12_4_;
            uVar11 = (ulong)bVar20;
            do {
              auVar22 = auVar62._0_16_;
              uVar10 = 0;
              for (uVar21 = uVar11; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                uVar10 = uVar10 + 1;
              }
              pGVar4 = (local_1470->geometries).items
                       [*(uint *)(lVar12 + uVar15 + 0x90 + uVar10 * 4)].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0077e4af:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar19;
                }
                local_12d8 = auVar58._0_32_;
                local_12b8 = vmovdqu64_avx512vl(auVar57._0_32_);
                local_1298 = vmovdqu64_avx512vl(auVar56._0_32_);
                local_1278 = auVar55._0_32_;
                local_1258 = auVar54._0_32_;
                local_1238 = auVar53._0_32_;
                local_1218 = auVar52._0_32_;
                local_11f8 = auVar51._0_32_;
                uVar21 = (ulong)(uint)((int)uVar10 * 4);
                uVar1 = *(undefined4 *)((long)local_13c8 + uVar21);
                local_1338._4_4_ = uVar1;
                local_1338._0_4_ = uVar1;
                local_1338._8_4_ = uVar1;
                local_1338._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_13b8 + uVar21);
                local_1328._4_4_ = uVar1;
                local_1328._0_4_ = uVar1;
                local_1328._8_4_ = uVar1;
                local_1328._12_4_ = uVar1;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar21);
                args.context = context->user;
                local_1308 = vpbroadcastd_avx512vl();
                uVar1 = *(undefined4 *)(lVar12 + uVar15 + 0xa0 + uVar21);
                local_1318._4_4_ = uVar1;
                local_1318._0_4_ = uVar1;
                local_1318._8_4_ = uVar1;
                local_1318._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_1398 + uVar21);
                uVar3 = *(undefined4 *)(local_1388 + uVar21);
                local_1358._4_4_ = uVar3;
                local_1358._0_4_ = uVar3;
                local_1358._8_4_ = uVar3;
                local_1358._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1378 + uVar21);
                local_1348._4_4_ = uVar3;
                local_1348._0_4_ = uVar3;
                local_1348._8_4_ = uVar3;
                local_1348._12_4_ = uVar3;
                local_1368[0] = (RTCHitN)(char)uVar1;
                local_1368[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1368[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1368[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1368[4] = (RTCHitN)(char)uVar1;
                local_1368[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1368[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1368[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1368[8] = (RTCHitN)(char)uVar1;
                local_1368[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1368[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1368[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1368[0xc] = (RTCHitN)(char)uVar1;
                local_1368[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1368[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1368[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                uStack_12f4 = (args.context)->instID[0];
                local_12f8 = uStack_12f4;
                uStack_12f0 = uStack_12f4;
                uStack_12ec = uStack_12f4;
                uStack_12e8 = (args.context)->instPrimID[0];
                uStack_12e4 = uStack_12e8;
                uStack_12e0 = uStack_12e8;
                uStack_12dc = uStack_12e8;
                auVar33 = auVar59._0_16_;
                local_14a8 = vmovdqa64_avx512vl(auVar33);
                args.valid = (int *)local_14a8;
                args.geometryUserPtr = pGVar4->userPtr;
                args.hit = local_1368;
                args.N = 4;
                auVar35 = vmovdqa64_avx512vl(auVar33);
                auVar33 = vmovdqa64_avx512vl(auVar33);
                args.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&args);
                  auVar33 = local_14a8;
                }
                uVar21 = vptestmd_avx512vl(auVar33,auVar33);
                if ((uVar21 & 0xf) != 0) {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&args);
                    auVar33 = local_14a8;
                  }
                  uVar21 = vptestmd_avx512vl(auVar33,auVar33);
                  uVar21 = uVar21 & 0xf;
                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar18 = (bool)((byte)uVar21 & 1);
                  auVar34._0_4_ =
                       (uint)bVar18 * auVar33._0_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x80);
                  bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
                  auVar34._4_4_ =
                       (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x84);
                  bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
                  auVar34._8_4_ =
                       (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x88);
                  bVar18 = SUB81(uVar21 >> 3,0);
                  auVar34._12_4_ =
                       (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar34;
                  if ((byte)uVar21 != 0) goto LAB_0077e4af;
                }
                *(float *)(ray + k * 4 + 0x80) = fVar2;
                auVar51 = ZEXT3264(local_11f8);
                auVar52 = ZEXT3264(local_1218);
                auVar53 = ZEXT3264(local_1238);
                auVar54 = ZEXT3264(local_1258);
                auVar55 = ZEXT3264(local_1278);
                auVar36 = vmovdqu64_avx512vl(local_1298);
                auVar56 = ZEXT3264(auVar36);
                auVar36 = vmovdqu64_avx512vl(local_12b8);
                auVar57 = ZEXT3264(auVar36);
                auVar58 = ZEXT3264(local_12d8);
                auVar35 = vmovdqa64_avx512vl(auVar35);
                auVar59 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar60 = ZEXT1664(auVar35);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar61 = ZEXT1664(auVar35);
                auVar22 = vxorps_avx512vl(auVar22,auVar22);
                auVar62 = ZEXT1664(auVar22);
                auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar63 = ZEXT1664(auVar22);
              }
              uVar11 = uVar11 ^ 1L << (uVar10 & 0x3f);
            } while (uVar11 != 0);
          }
        }
        local_1490 = local_1490 + 1;
      } while (local_1490 != local_1488);
    }
LAB_0077e47a:
    bVar19 = local_1478 != stack;
    if (!bVar19) {
      return bVar19;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }